

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void predict_or_learn_adf<true,false>(warm_cb *data,multi_learner *base,example *ec)

{
  label_t lVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  lVar1 = (ec->l).multi;
  data->mc_label = lVar1;
  uVar3 = data->ws_period;
  uVar4 = data->ws_iter;
  if (uVar4 < uVar3) {
    uVar2 = corrupt_action(data,lVar1.label,1);
    (ec->l).multi.label = uVar2;
    uVar3 = data->ws_period;
    uVar4 = data->ws_iter;
  }
  if (uVar4 < uVar3) {
    if (data->ws_type == 2) {
      predict_or_learn_bandit_adf<false>(data,base,ec,1);
    }
    else if (data->ws_type == 1) {
      predict_or_learn_sup_adf<false>(data,base,ec,1);
    }
    ec->weight = 0.0;
    data->ws_iter = data->ws_iter + 1;
  }
  else if (data->inter_iter < data->inter_period) {
    predict_or_learn_bandit_adf<false>(data,base,ec,2);
    accumu_var_adf(data,base,ec);
    v_array<ACTION_SCORE::action_score>::clear(&data->a_s_adf);
    data->inter_iter = data->inter_iter + 1;
  }
  else {
    ec->weight = 0.0;
    (ec->pred).scalar = 1.4013e-45;
  }
  (ec->l).multi = data->mc_label;
  return;
}

Assistant:

void predict_or_learn_adf(warm_cb& data, multi_learner& base, example& ec)
{
	// Corrupt labels (only corrupting multiclass labels as of now)
	if (use_cs)
		data.cs_label = ec.l.cs;
	else
	{
		data.mc_label = ec.l.multi;
		if (data.ws_iter < data.ws_period)
			ec.l.multi.label = corrupt_action(data, data.mc_label.label, WARM_START);
	}

	// Warm start phase
	if (data.ws_iter < data.ws_period)
	{
			if (data.ws_type == SUPERVISED_WS)
				predict_or_learn_sup_adf<use_cs>(data, base, ec, WARM_START);
			else if (data.ws_type == BANDIT_WS)
				predict_or_learn_bandit_adf<use_cs>(data, base, ec, WARM_START);

		ec.weight = 0;
		data.ws_iter++;
	}
	// Interaction phase
	else if (data.inter_iter < data.inter_period)
	{
		predict_or_learn_bandit_adf<use_cs>(data, base, ec, INTERACTION);
		accumu_var_adf(data, base, ec);
		data.a_s_adf.clear();
		data.inter_iter++;
	}
	// Skipping the rest of the examples
	else
	{
    ec.weight = 0;
    ec.pred.multiclass = 1;
  }

	// Restore the original labels
	if (use_cs)
		ec.l.cs = data.cs_label;
	else
		ec.l.multi = data.mc_label;

}